

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O3

bool MovementsLegal(Movement move,Situation *situation)

{
  int iVar1;
  ushort uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  uint *puVar7;
  uint uVar8;
  UINT8 UVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  iVar1 = situation->current_player;
  uVar8 = iVar1 * 0x10 + 0x10;
  if ((uVar8 & situation->current_board[move.from]) == 0) {
    return false;
  }
  uVar10 = move._0_4_;
  uVar11 = uVar10 >> 8;
  uVar3 = uVar11 & 0xff;
  UVar9 = move.capture;
  if (situation->current_board[uVar3] != UVar9) {
    return false;
  }
  uVar8 = situation->current_board[move.from] - uVar8;
  if (10 < uVar8) {
    if ((LEGAL_POSITION[iVar1][uVar3] & 8) == 0) {
      return false;
    }
    puVar7 = (uint *)((long)PAWN_CAN_GET[0][iVar1] + (ulong)((uint)move.from * 0x50));
    do {
      uVar8 = *puVar7;
      if (uVar8 == 0) break;
      puVar7 = puVar7 + 1;
    } while (uVar8 != uVar3);
    bVar12 = uVar8 == 0;
    goto LAB_00109b0c;
  }
  uVar5 = uVar10 & 0xff;
  switch(uVar8) {
  case 0:
    if ((LEGAL_POSITION[iVar1][uVar3] & 2) != 0) {
      return ""[(uVar3 - uVar5) + 0x100] == '\x01';
    }
    break;
  default:
    if ((LEGAL_POSITION[iVar1][uVar3] & 4) != 0) {
      return ""[(uVar3 - uVar5) + 0x100] == '\x02';
    }
    break;
  case 3:
  case 4:
    if (((LEGAL_POSITION[iVar1][uVar3] & 0x10) != 0) && (""[(uVar3 - uVar5) + 0x100] == '\x03')) {
      uVar4 = (ulong)(uVar3 + uVar5 >> 1);
LAB_00109948:
      return situation->current_board[uVar4] == '\0';
    }
    break;
  case 5:
  case 6:
    if (HORSE_LEGAL_MOVE[(uVar3 - uVar5) + 0x100] != 0) {
      uVar4 = (ulong)(int)(HORSE_LEGAL_MOVE[(uVar3 - uVar5) + 0x100] + uVar5);
      goto LAB_00109948;
    }
    break;
  case 7:
  case 8:
    uVar5 = uVar5 >> 4;
    if ((uVar10 & 0xf) != (uVar11 & 0xf)) {
      if (uVar5 != uVar3 >> 4) {
        return false;
      }
      lVar6 = (long)(int)((uVar10 & 0xf) - 3);
      uVar4 = (ulong)situation->bit_row[uVar5];
      uVar2 = BIT_ROW_MASK[uVar3];
      if (UVar9 != '\0') {
        bVar12 = (*(ushort *)(lVar6 * 0x1000 + 0x325d52 + uVar4 * 8) & uVar2) == 0;
        goto LAB_00109b0c;
      }
LAB_00109afd:
      bVar12 = (ROOK_CANNON_CAN_GET_ROW_MASK[lVar6][uVar4].no_capture & uVar2) == 0;
      goto LAB_00109b0c;
    }
    lVar6 = (long)(int)(uVar5 - 3);
    uVar4 = (ulong)situation->bit_col[uVar10 & 0xf];
    uVar2 = BIT_COL_MASK[uVar3];
    if (UVar9 != '\0') {
      bVar12 = (*(ushort *)(lVar6 * 0x2000 + 0x32ed52 + uVar4 * 8) & uVar2) == 0;
      goto LAB_00109b0c;
    }
    goto LAB_00109ac4;
  case 9:
  case 10:
    uVar5 = uVar5 >> 4;
    if ((uVar10 & 0xf) != (uVar11 & 0xf)) {
      if (uVar5 != uVar3 >> 4) {
        return false;
      }
      lVar6 = (long)(int)((uVar10 & 0xf) - 3);
      uVar4 = (ulong)situation->bit_row[uVar5];
      uVar2 = BIT_ROW_MASK[uVar3];
      if (UVar9 != '\0') {
        bVar12 = (*(ushort *)(lVar6 * 0x1000 + 0x325d54 + uVar4 * 8) & uVar2) == 0;
        goto LAB_00109b0c;
      }
      goto LAB_00109afd;
    }
    lVar6 = (long)(int)(uVar5 - 3);
    uVar4 = (ulong)situation->bit_col[uVar10 & 0xf];
    uVar2 = BIT_COL_MASK[uVar3];
    if (UVar9 != '\0') {
      bVar12 = (*(ushort *)(lVar6 * 0x2000 + 0x32ed54 + uVar4 * 8) & uVar2) == 0;
      goto LAB_00109b0c;
    }
LAB_00109ac4:
    bVar12 = (ROOK_CANNON_CAN_GET_COL_MASK[lVar6][uVar4].no_capture & uVar2) == 0;
LAB_00109b0c:
    return !bVar12;
  }
  return false;
}

Assistant:

bool MovementsLegal(const Movement move, const Situation & situation){
    int from = move.from, to = move.to, player_flag = GetPlayerFlag(situation.current_player), player = situation.current_player;
    int piece_id_from = situation.current_board[from];
    int from_col = 0, from_row = 0, to_col = 0, to_row = 0;
    // 1. 判断出发点是否为自己的棋子(包含判断是否是没有棋子)
    if((piece_id_from & player_flag) == 0){
        return false;
    }
    // 2. 对目标点进行判断
    if(situation.current_board[to] != move.capture){
        return false;
    }
    // 3.对出发点的棋子进行分类讨论
    switch (piece_id_from - player_flag){
    // 3.1 将(帅)
    case 0:
        return (LEGAL_POSITION[player][to] & POSITION_MASK[0]) && (LEGAL_MOVE[to - from + 256] == 1);
    // 3.2 仕
    case 1:
    case 2:
        return (LEGAL_POSITION[player][to] & POSITION_MASK[1]) && (LEGAL_MOVE[to - from + 256] == 2);
    // 3.3 象
    case 3:
    case 4:
        return (LEGAL_POSITION[player][to] & POSITION_MASK[2]) && (LEGAL_MOVE[to - from + 256] == 3) && (situation.current_board[(to + from) >> 1] == 0);
    // 3.4 马
    case 5:
    case 6: {
        int horse_leg = HORSE_LEGAL_MOVE[to - from + 256] + from;
        return (horse_leg != from) && (situation.current_board[horse_leg] == 0);
    }
    // 3.5 车
    case 7:
    case 8:
        from_col = GetCol(from), from_row = GetRow(from), to_col = GetCol(to), to_row = GetRow(to);
        // 3.5.1 如果在同一列
        if(from_col == to_col){
            if(move.capture){
                return (ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].rook_capture & BIT_COL_MASK[to]) != 0;
            }
            else{
                return (ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].no_capture & BIT_COL_MASK[to]) != 0;
            }
        }
        // 3.5.2 如果在同一行
        else if(from_row == to_row){
            if(move.capture){
                return (ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].rook_capture & BIT_ROW_MASK[to]) != 0;
            }
            else{
                return (ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].no_capture & BIT_ROW_MASK[to]) != 0;
            }
        }
        // 3.5.2 不在同一行列
        else{
            return false;
        }
    // 3.6 炮
    case 9:
    case 10:
        from_col = GetCol(from), from_row = GetRow(from), to_col = GetCol(to), to_row = GetRow(to);
        // 3.6.1 如果在同一列
        if(from_col == to_col){
            if(move.capture){
                return (ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].cannon_capture & BIT_COL_MASK[to]) != 0;
            }
            else{
                return (ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].no_capture & BIT_COL_MASK[to]) != 0;
            }
        }
        // 3.6.2 如果在同一行
        else if(from_row == to_row){
            if(move.capture){
                return (ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].cannon_capture & BIT_ROW_MASK[to]) != 0;
            }
            else{
                return (ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].no_capture & BIT_ROW_MASK[to]) != 0;
            }
        }
        // 3.6.2 不在同一行列
        else{
            return false;
        }
    // 3.7 兵
    default:
        if(!(LEGAL_POSITION[player][to] & POSITION_MASK[6])){
            return false;
        }
        for(int i = 0; PAWN_CAN_GET[from][player][i] != 0; i ++){
            if(PAWN_CAN_GET[from][player][i] == to){
                return true;
            }
        }
        return false;
    }
}